

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

void __thiscall
QTextCursor::selectedTableCells
          (QTextCursor *this,int *firstRow,int *numRows,int *firstColumn,int *numColumns)

{
  QTextCursorPrivate *this_00;
  
  *firstRow = -1;
  *firstColumn = -1;
  *numRows = -1;
  *numColumns = -1;
  this_00 = (this->d).d.ptr;
  if ((this_00 != (QTextCursorPrivate *)0x0) && (this_00->position != this_00->anchor)) {
    QTextCursorPrivate::selectedTableCells(this_00,firstRow,numRows,firstColumn,numColumns);
    return;
  }
  return;
}

Assistant:

void QTextCursor::selectedTableCells(int *firstRow, int *numRows, int *firstColumn, int *numColumns) const
{
    *firstRow = -1;
    *firstColumn = -1;
    *numRows = -1;
    *numColumns = -1;

    if (!d || d->position == d->anchor)
        return;

    d->selectedTableCells(firstRow, numRows, firstColumn, numColumns);
}